

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspline_patch.h
# Opt level: O1

void __thiscall
embree::BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,float u,float v,
          vfloat_impl<4> *P,vfloat_impl<4> *dPdu,vfloat_impl<4> *dPdv,vfloat_impl<4> *ddPdudu,
          vfloat_impl<4> *ddPdvdv,vfloat_impl<4> *ddPdudv,float dscale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float t_2;
  float fVar48;
  float fVar49;
  float t;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float t_1;
  
  if (P != (vfloat_impl<4> *)0x0) {
    fVar45 = 1.0 - v;
    fVar52 = fVar45 * v * fVar45;
    fVar54 = v * v * v;
    fVar56 = fVar45 * v * v;
    fVar45 = fVar45 * fVar45 * fVar45;
    fVar49 = fVar45 * 0.16666667;
    fVar50 = (fVar52 * 12.0 + fVar56 * 6.0 + fVar45 * 4.0 + fVar54) * 0.16666667;
    fVar58 = (fVar56 * 12.0 + fVar52 * 6.0 + fVar54 * 4.0 + fVar45) * 0.16666667;
    fVar54 = fVar54 * 0.16666667;
    fVar45 = this->v[3][0].field_0.v[1];
    fVar52 = this->v[3][0].field_0.v[2];
    fVar56 = this->v[3][0].field_0.v[3];
    fVar1 = this->v[2][0].field_0.v[1];
    fVar2 = this->v[2][0].field_0.v[2];
    fVar3 = this->v[2][0].field_0.v[3];
    fVar47 = this->v[1][0].field_0.v[1];
    fVar4 = this->v[1][0].field_0.v[2];
    fVar5 = this->v[1][0].field_0.v[3];
    fVar6 = this->v[0][0].field_0.v[1];
    fVar7 = this->v[0][0].field_0.v[2];
    fVar8 = this->v[0][0].field_0.v[3];
    fVar9 = this->v[3][1].field_0.v[1];
    fVar10 = this->v[3][1].field_0.v[2];
    fVar11 = this->v[3][1].field_0.v[3];
    fVar12 = this->v[2][1].field_0.v[1];
    fVar13 = this->v[2][1].field_0.v[2];
    fVar14 = this->v[2][1].field_0.v[3];
    fVar15 = this->v[1][1].field_0.v[1];
    fVar16 = this->v[1][1].field_0.v[2];
    fVar17 = this->v[1][1].field_0.v[3];
    fVar18 = this->v[0][1].field_0.v[1];
    fVar19 = this->v[0][1].field_0.v[2];
    fVar20 = this->v[0][1].field_0.v[3];
    fVar21 = this->v[3][2].field_0.v[1];
    fVar22 = this->v[3][2].field_0.v[2];
    fVar23 = this->v[3][2].field_0.v[3];
    fVar24 = this->v[2][2].field_0.v[1];
    fVar25 = this->v[2][2].field_0.v[2];
    fVar26 = this->v[2][2].field_0.v[3];
    fVar27 = this->v[1][2].field_0.v[1];
    fVar28 = this->v[1][2].field_0.v[2];
    fVar29 = this->v[1][2].field_0.v[3];
    fVar30 = this->v[0][2].field_0.v[1];
    fVar31 = this->v[0][2].field_0.v[2];
    fVar32 = this->v[0][2].field_0.v[3];
    fVar33 = this->v[3][3].field_0.v[1];
    fVar34 = this->v[3][3].field_0.v[2];
    fVar35 = this->v[3][3].field_0.v[3];
    fVar36 = this->v[2][3].field_0.v[1];
    fVar37 = this->v[2][3].field_0.v[2];
    fVar38 = this->v[2][3].field_0.v[3];
    fVar39 = this->v[1][3].field_0.v[1];
    fVar40 = this->v[1][3].field_0.v[2];
    fVar41 = this->v[1][3].field_0.v[3];
    fVar42 = this->v[0][3].field_0.v[1];
    fVar43 = this->v[0][3].field_0.v[2];
    fVar44 = this->v[0][3].field_0.v[3];
    fVar46 = 1.0 - u;
    fVar57 = fVar46 * u * fVar46;
    fVar51 = u * u * u;
    fVar53 = fVar46 * u * u;
    fVar46 = fVar46 * fVar46 * fVar46;
    fVar48 = fVar46 * 0.16666667;
    fVar55 = (fVar57 * 12.0 + fVar53 * 6.0 + fVar46 * 4.0 + fVar51) * 0.16666667;
    fVar46 = (fVar53 * 12.0 + fVar57 * 6.0 + fVar51 * 4.0 + fVar46) * 0.16666667;
    fVar51 = fVar51 * 0.16666667;
    (P->field_0).v[0] =
         fVar51 * (fVar49 * this->v[0][3].field_0.v[0] +
                  fVar50 * this->v[1][3].field_0.v[0] +
                  fVar58 * this->v[2][3].field_0.v[0] + fVar54 * this->v[3][3].field_0.v[0]) +
         fVar46 * (this->v[0][2].field_0.v[0] * fVar49 +
                  this->v[1][2].field_0.v[0] * fVar50 +
                  this->v[2][2].field_0.v[0] * fVar58 + this->v[3][2].field_0.v[0] * fVar54) +
         fVar55 * (this->v[0][1].field_0.v[0] * fVar49 +
                  this->v[1][1].field_0.v[0] * fVar50 +
                  this->v[2][1].field_0.v[0] * fVar58 + this->v[3][1].field_0.v[0] * fVar54) +
         fVar48 * (this->v[0][0].field_0.v[0] * fVar49 +
                  this->v[1][0].field_0.v[0] * fVar50 +
                  this->v[2][0].field_0.v[0] * fVar58 + this->v[3][0].field_0.v[0] * fVar54);
    (P->field_0).v[1] =
         fVar51 * (fVar49 * fVar42 + fVar50 * fVar39 + fVar58 * fVar36 + fVar54 * fVar33) +
         fVar46 * (fVar30 * fVar49 + fVar27 * fVar50 + fVar24 * fVar58 + fVar21 * fVar54) +
         fVar55 * (fVar18 * fVar49 + fVar15 * fVar50 + fVar12 * fVar58 + fVar9 * fVar54) +
         fVar48 * (fVar6 * fVar49 + fVar47 * fVar50 + fVar1 * fVar58 + fVar45 * fVar54);
    (P->field_0).v[2] =
         fVar51 * (fVar49 * fVar43 + fVar50 * fVar40 + fVar58 * fVar37 + fVar54 * fVar34) +
         fVar46 * (fVar31 * fVar49 + fVar28 * fVar50 + fVar25 * fVar58 + fVar22 * fVar54) +
         fVar55 * (fVar19 * fVar49 + fVar16 * fVar50 + fVar13 * fVar58 + fVar10 * fVar54) +
         fVar48 * (fVar7 * fVar49 + fVar4 * fVar50 + fVar2 * fVar58 + fVar52 * fVar54);
    (P->field_0).v[3] =
         fVar51 * (fVar49 * fVar44 + fVar50 * fVar41 + fVar58 * fVar38 + fVar54 * fVar35) +
         fVar46 * (fVar32 * fVar49 + fVar29 * fVar50 + fVar26 * fVar58 + fVar23 * fVar54) +
         fVar55 * (fVar20 * fVar49 + fVar17 * fVar50 + fVar14 * fVar58 + fVar11 * fVar54) +
         fVar48 * (fVar8 * fVar49 + fVar5 * fVar50 + fVar3 * fVar58 + fVar56 * fVar54);
  }
  if (dPdu != (vfloat_impl<4> *)0x0) {
    fVar50 = 1.0 - v;
    fVar45 = fVar50 * fVar50 * fVar50;
    fVar49 = v * v * v;
    fVar51 = fVar50 * v;
    fVar54 = fVar45 * 0.16666667;
    fVar59 = (fVar50 * fVar51 * 12.0 + fVar51 * v * 6.0 + fVar45 * 4.0 + fVar49) * 0.16666667;
    fVar57 = (fVar51 * v * 12.0 + fVar50 * fVar51 * 6.0 + fVar49 * 4.0 + fVar45) * 0.16666667;
    fVar49 = fVar49 * 0.16666667;
    fVar45 = this->v[3][0].field_0.v[1];
    fVar52 = this->v[3][0].field_0.v[2];
    fVar56 = this->v[3][0].field_0.v[3];
    fVar1 = this->v[2][0].field_0.v[1];
    fVar2 = this->v[2][0].field_0.v[2];
    fVar3 = this->v[2][0].field_0.v[3];
    fVar47 = this->v[1][0].field_0.v[1];
    fVar4 = this->v[1][0].field_0.v[2];
    fVar5 = this->v[1][0].field_0.v[3];
    fVar6 = this->v[0][0].field_0.v[1];
    fVar7 = this->v[0][0].field_0.v[2];
    fVar8 = this->v[0][0].field_0.v[3];
    fVar9 = this->v[3][1].field_0.v[1];
    fVar10 = this->v[3][1].field_0.v[2];
    fVar11 = this->v[3][1].field_0.v[3];
    fVar12 = this->v[2][1].field_0.v[1];
    fVar13 = this->v[2][1].field_0.v[2];
    fVar14 = this->v[2][1].field_0.v[3];
    fVar15 = this->v[1][1].field_0.v[1];
    fVar16 = this->v[1][1].field_0.v[2];
    fVar17 = this->v[1][1].field_0.v[3];
    fVar18 = this->v[0][1].field_0.v[1];
    fVar19 = this->v[0][1].field_0.v[2];
    fVar20 = this->v[0][1].field_0.v[3];
    fVar21 = this->v[3][2].field_0.v[1];
    fVar22 = this->v[3][2].field_0.v[2];
    fVar23 = this->v[3][2].field_0.v[3];
    fVar24 = this->v[2][2].field_0.v[1];
    fVar25 = this->v[2][2].field_0.v[2];
    fVar26 = this->v[2][2].field_0.v[3];
    fVar27 = this->v[1][2].field_0.v[1];
    fVar28 = this->v[1][2].field_0.v[2];
    fVar29 = this->v[1][2].field_0.v[3];
    fVar30 = this->v[0][2].field_0.v[1];
    fVar31 = this->v[0][2].field_0.v[2];
    fVar32 = this->v[0][2].field_0.v[3];
    fVar33 = this->v[3][3].field_0.v[1];
    fVar34 = this->v[3][3].field_0.v[2];
    fVar35 = this->v[3][3].field_0.v[3];
    fVar36 = this->v[2][3].field_0.v[1];
    fVar37 = this->v[2][3].field_0.v[2];
    fVar38 = this->v[2][3].field_0.v[3];
    fVar39 = this->v[1][3].field_0.v[1];
    fVar40 = this->v[1][3].field_0.v[2];
    fVar41 = this->v[1][3].field_0.v[3];
    fVar42 = this->v[0][3].field_0.v[1];
    fVar43 = this->v[0][3].field_0.v[2];
    fVar44 = this->v[0][3].field_0.v[3];
    fVar53 = 1.0 - u;
    fVar48 = -fVar53 * fVar53 * 0.5;
    fVar55 = fVar53 * u;
    fVar58 = (-u * u - fVar55 * 4.0) * 0.5;
    fVar60 = (fVar55 * 4.0 + fVar53 * fVar53) * 0.5;
    fVar46 = u * u * 0.5;
    (dPdu->field_0).v[0] =
         (fVar46 * (fVar54 * this->v[0][3].field_0.v[0] +
                   fVar59 * this->v[1][3].field_0.v[0] +
                   fVar57 * this->v[2][3].field_0.v[0] + fVar49 * this->v[3][3].field_0.v[0]) +
          fVar60 * (this->v[0][2].field_0.v[0] * fVar54 +
                   this->v[1][2].field_0.v[0] * fVar59 +
                   this->v[2][2].field_0.v[0] * fVar57 + this->v[3][2].field_0.v[0] * fVar49) +
          fVar58 * (this->v[0][1].field_0.v[0] * fVar54 +
                   this->v[1][1].field_0.v[0] * fVar59 +
                   this->v[2][1].field_0.v[0] * fVar57 + this->v[3][1].field_0.v[0] * fVar49) +
         fVar48 * (this->v[0][0].field_0.v[0] * fVar54 +
                  this->v[1][0].field_0.v[0] * fVar59 +
                  this->v[2][0].field_0.v[0] * fVar57 + this->v[3][0].field_0.v[0] * fVar49)) *
         dscale;
    (dPdu->field_0).v[1] =
         (fVar46 * (fVar54 * fVar42 + fVar59 * fVar39 + fVar57 * fVar36 + fVar49 * fVar33) +
          fVar60 * (fVar30 * fVar54 + fVar27 * fVar59 + fVar24 * fVar57 + fVar21 * fVar49) +
          fVar58 * (fVar18 * fVar54 + fVar15 * fVar59 + fVar12 * fVar57 + fVar9 * fVar49) +
         fVar48 * (fVar6 * fVar54 + fVar47 * fVar59 + fVar1 * fVar57 + fVar45 * fVar49)) * dscale;
    (dPdu->field_0).v[2] =
         (fVar46 * (fVar54 * fVar43 + fVar59 * fVar40 + fVar57 * fVar37 + fVar49 * fVar34) +
          fVar60 * (fVar31 * fVar54 + fVar28 * fVar59 + fVar25 * fVar57 + fVar22 * fVar49) +
          fVar58 * (fVar19 * fVar54 + fVar16 * fVar59 + fVar13 * fVar57 + fVar10 * fVar49) +
         fVar48 * (fVar7 * fVar54 + fVar4 * fVar59 + fVar2 * fVar57 + fVar52 * fVar49)) * dscale;
    (dPdu->field_0).v[3] =
         (fVar46 * (fVar54 * fVar44 + fVar59 * fVar41 + fVar57 * fVar38 + fVar49 * fVar35) +
          fVar60 * (fVar32 * fVar54 + fVar29 * fVar59 + fVar26 * fVar57 + fVar23 * fVar49) +
          fVar58 * (fVar20 * fVar54 + fVar17 * fVar59 + fVar14 * fVar57 + fVar11 * fVar49) +
         fVar48 * (fVar8 * fVar54 + fVar5 * fVar59 + fVar3 * fVar57 + fVar56 * fVar49)) * dscale;
    fVar49 = -fVar50 * fVar50 * 0.5;
    fVar54 = (-v * v - fVar51 * 4.0) * 0.5;
    fVar46 = (fVar51 * 4.0 + fVar50 * fVar50) * 0.5;
    fVar51 = v * v * 0.5;
    fVar45 = this->v[3][0].field_0.v[1];
    fVar52 = this->v[3][0].field_0.v[2];
    fVar56 = this->v[3][0].field_0.v[3];
    fVar1 = this->v[2][0].field_0.v[1];
    fVar2 = this->v[2][0].field_0.v[2];
    fVar3 = this->v[2][0].field_0.v[3];
    fVar47 = this->v[1][0].field_0.v[1];
    fVar4 = this->v[1][0].field_0.v[2];
    fVar5 = this->v[1][0].field_0.v[3];
    fVar6 = this->v[0][0].field_0.v[1];
    fVar7 = this->v[0][0].field_0.v[2];
    fVar8 = this->v[0][0].field_0.v[3];
    fVar9 = this->v[3][1].field_0.v[1];
    fVar10 = this->v[3][1].field_0.v[2];
    fVar11 = this->v[3][1].field_0.v[3];
    fVar12 = this->v[2][1].field_0.v[1];
    fVar13 = this->v[2][1].field_0.v[2];
    fVar14 = this->v[2][1].field_0.v[3];
    fVar15 = this->v[1][1].field_0.v[1];
    fVar16 = this->v[1][1].field_0.v[2];
    fVar17 = this->v[1][1].field_0.v[3];
    fVar18 = this->v[0][1].field_0.v[1];
    fVar19 = this->v[0][1].field_0.v[2];
    fVar20 = this->v[0][1].field_0.v[3];
    fVar21 = this->v[3][2].field_0.v[1];
    fVar22 = this->v[3][2].field_0.v[2];
    fVar23 = this->v[3][2].field_0.v[3];
    fVar24 = this->v[2][2].field_0.v[1];
    fVar25 = this->v[2][2].field_0.v[2];
    fVar26 = this->v[2][2].field_0.v[3];
    fVar27 = this->v[1][2].field_0.v[1];
    fVar28 = this->v[1][2].field_0.v[2];
    fVar29 = this->v[1][2].field_0.v[3];
    fVar30 = this->v[0][2].field_0.v[1];
    fVar31 = this->v[0][2].field_0.v[2];
    fVar32 = this->v[0][2].field_0.v[3];
    fVar33 = this->v[3][3].field_0.v[1];
    fVar34 = this->v[3][3].field_0.v[2];
    fVar35 = this->v[3][3].field_0.v[3];
    fVar36 = this->v[2][3].field_0.v[1];
    fVar37 = this->v[2][3].field_0.v[2];
    fVar38 = this->v[2][3].field_0.v[3];
    fVar39 = this->v[1][3].field_0.v[1];
    fVar40 = this->v[1][3].field_0.v[2];
    fVar41 = this->v[1][3].field_0.v[3];
    fVar42 = this->v[0][3].field_0.v[1];
    fVar43 = this->v[0][3].field_0.v[2];
    fVar44 = this->v[0][3].field_0.v[3];
    fVar50 = fVar53 * fVar53 * fVar53;
    fVar58 = u * u * u;
    fVar57 = fVar50 * 0.16666667;
    fVar48 = (fVar53 * fVar55 * 12.0 + fVar55 * u * 6.0 + fVar50 * 4.0 + fVar58) * 0.16666667;
    fVar50 = (fVar55 * u * 12.0 + fVar53 * fVar55 * 6.0 + fVar58 * 4.0 + fVar50) * 0.16666667;
    fVar58 = fVar58 * 0.16666667;
    (dPdv->field_0).v[0] =
         (fVar58 * (fVar49 * this->v[0][3].field_0.v[0] +
                   fVar54 * this->v[1][3].field_0.v[0] +
                   fVar46 * this->v[2][3].field_0.v[0] + fVar51 * this->v[3][3].field_0.v[0]) +
          fVar50 * (this->v[0][2].field_0.v[0] * fVar49 +
                   this->v[1][2].field_0.v[0] * fVar54 +
                   this->v[2][2].field_0.v[0] * fVar46 + this->v[3][2].field_0.v[0] * fVar51) +
          fVar48 * (this->v[0][1].field_0.v[0] * fVar49 +
                   this->v[1][1].field_0.v[0] * fVar54 +
                   this->v[2][1].field_0.v[0] * fVar46 + this->v[3][1].field_0.v[0] * fVar51) +
         fVar57 * (this->v[0][0].field_0.v[0] * fVar49 +
                  this->v[1][0].field_0.v[0] * fVar54 +
                  this->v[2][0].field_0.v[0] * fVar46 + this->v[3][0].field_0.v[0] * fVar51)) *
         dscale;
    (dPdv->field_0).v[1] =
         (fVar58 * (fVar49 * fVar42 + fVar54 * fVar39 + fVar46 * fVar36 + fVar51 * fVar33) +
          fVar50 * (fVar30 * fVar49 + fVar27 * fVar54 + fVar24 * fVar46 + fVar21 * fVar51) +
          fVar48 * (fVar18 * fVar49 + fVar15 * fVar54 + fVar12 * fVar46 + fVar9 * fVar51) +
         fVar57 * (fVar6 * fVar49 + fVar47 * fVar54 + fVar1 * fVar46 + fVar45 * fVar51)) * dscale;
    (dPdv->field_0).v[2] =
         (fVar58 * (fVar49 * fVar43 + fVar54 * fVar40 + fVar46 * fVar37 + fVar51 * fVar34) +
          fVar50 * (fVar31 * fVar49 + fVar28 * fVar54 + fVar25 * fVar46 + fVar22 * fVar51) +
          fVar48 * (fVar19 * fVar49 + fVar16 * fVar54 + fVar13 * fVar46 + fVar10 * fVar51) +
         fVar57 * (fVar7 * fVar49 + fVar4 * fVar54 + fVar2 * fVar46 + fVar52 * fVar51)) * dscale;
    (dPdv->field_0).v[3] =
         (fVar58 * (fVar49 * fVar44 + fVar54 * fVar41 + fVar46 * fVar38 + fVar51 * fVar35) +
          fVar50 * (fVar32 * fVar49 + fVar29 * fVar54 + fVar26 * fVar46 + fVar23 * fVar51) +
          fVar48 * (fVar20 * fVar49 + fVar17 * fVar54 + fVar14 * fVar46 + fVar11 * fVar51) +
         fVar57 * (fVar8 * fVar49 + fVar5 * fVar54 + fVar3 * fVar46 + fVar56 * fVar51)) * dscale;
  }
  if (ddPdudu != (vfloat_impl<4> *)0x0) {
    fVar58 = 1.0 - v;
    fVar49 = fVar58 * fVar58 * fVar58;
    fVar47 = v * v * v;
    fVar57 = fVar58 * v;
    fVar46 = (fVar57 * v * 12.0 + fVar58 * fVar57 * 6.0 + fVar47 * 4.0 + fVar49) * 0.16666667;
    fVar50 = fVar47 * 0.16666667;
    fVar45 = this->v[3][0].field_0.v[1];
    fVar52 = this->v[3][0].field_0.v[2];
    fVar56 = this->v[3][0].field_0.v[3];
    fVar1 = this->v[2][0].field_0.v[1];
    fVar2 = this->v[2][0].field_0.v[2];
    fVar3 = this->v[2][0].field_0.v[3];
    fVar53 = (fVar58 * fVar57 * 12.0 + fVar57 * v * 6.0 + fVar49 * 4.0 + fVar47) * 0.16666667;
    fVar47 = this->v[1][0].field_0.v[1];
    fVar4 = this->v[1][0].field_0.v[2];
    fVar5 = this->v[1][0].field_0.v[3];
    fVar49 = fVar49 * 0.16666667;
    fVar6 = this->v[0][0].field_0.v[1];
    fVar7 = this->v[0][0].field_0.v[2];
    fVar8 = this->v[0][0].field_0.v[3];
    fVar9 = this->v[3][1].field_0.v[1];
    fVar10 = this->v[3][1].field_0.v[2];
    fVar11 = this->v[3][1].field_0.v[3];
    fVar12 = this->v[2][1].field_0.v[1];
    fVar13 = this->v[2][1].field_0.v[2];
    fVar14 = this->v[2][1].field_0.v[3];
    fVar15 = this->v[1][1].field_0.v[1];
    fVar16 = this->v[1][1].field_0.v[2];
    fVar17 = this->v[1][1].field_0.v[3];
    fVar18 = this->v[0][1].field_0.v[1];
    fVar19 = this->v[0][1].field_0.v[2];
    fVar20 = this->v[0][1].field_0.v[3];
    fVar21 = this->v[3][2].field_0.v[1];
    fVar22 = this->v[3][2].field_0.v[2];
    fVar23 = this->v[3][2].field_0.v[3];
    fVar24 = this->v[2][2].field_0.v[1];
    fVar25 = this->v[2][2].field_0.v[2];
    fVar26 = this->v[2][2].field_0.v[3];
    fVar27 = this->v[1][2].field_0.v[1];
    fVar28 = this->v[1][2].field_0.v[2];
    fVar29 = this->v[1][2].field_0.v[3];
    fVar30 = this->v[0][2].field_0.v[1];
    fVar31 = this->v[0][2].field_0.v[2];
    fVar32 = this->v[0][2].field_0.v[3];
    fVar33 = this->v[3][3].field_0.v[1];
    fVar34 = this->v[3][3].field_0.v[2];
    fVar35 = this->v[3][3].field_0.v[3];
    fVar36 = this->v[2][3].field_0.v[1];
    fVar37 = this->v[2][3].field_0.v[2];
    fVar38 = this->v[2][3].field_0.v[3];
    fVar39 = this->v[1][3].field_0.v[1];
    fVar40 = this->v[1][3].field_0.v[2];
    fVar41 = this->v[1][3].field_0.v[3];
    fVar42 = this->v[0][3].field_0.v[1];
    fVar43 = this->v[0][3].field_0.v[2];
    fVar44 = this->v[0][3].field_0.v[3];
    fVar55 = 1.0 - u;
    fVar51 = u - (fVar55 + fVar55);
    fVar54 = fVar55 - (u + u);
    fVar48 = dscale * dscale;
    (ddPdudu->field_0).v[0] =
         (u * (fVar49 * this->v[0][3].field_0.v[0] +
              fVar53 * this->v[1][3].field_0.v[0] +
              fVar46 * this->v[2][3].field_0.v[0] + fVar50 * this->v[3][3].field_0.v[0]) +
          fVar54 * (this->v[0][2].field_0.v[0] * fVar49 +
                   this->v[1][2].field_0.v[0] * fVar53 +
                   this->v[2][2].field_0.v[0] * fVar46 + this->v[3][2].field_0.v[0] * fVar50) +
          fVar51 * (this->v[0][1].field_0.v[0] * fVar49 +
                   this->v[1][1].field_0.v[0] * fVar53 +
                   this->v[2][1].field_0.v[0] * fVar46 + this->v[3][1].field_0.v[0] * fVar50) +
         fVar55 * (this->v[0][0].field_0.v[0] * fVar49 +
                  this->v[1][0].field_0.v[0] * fVar53 +
                  this->v[2][0].field_0.v[0] * fVar46 + this->v[3][0].field_0.v[0] * fVar50)) *
         fVar48;
    (ddPdudu->field_0).v[1] =
         (u * (fVar49 * fVar42 + fVar53 * fVar39 + fVar46 * fVar36 + fVar50 * fVar33) +
          fVar54 * (fVar30 * fVar49 + fVar27 * fVar53 + fVar24 * fVar46 + fVar21 * fVar50) +
          fVar51 * (fVar18 * fVar49 + fVar15 * fVar53 + fVar12 * fVar46 + fVar9 * fVar50) +
         fVar55 * (fVar6 * fVar49 + fVar47 * fVar53 + fVar1 * fVar46 + fVar45 * fVar50)) * fVar48;
    (ddPdudu->field_0).v[2] =
         (u * (fVar49 * fVar43 + fVar53 * fVar40 + fVar46 * fVar37 + fVar50 * fVar34) +
          fVar54 * (fVar31 * fVar49 + fVar28 * fVar53 + fVar25 * fVar46 + fVar22 * fVar50) +
          fVar51 * (fVar19 * fVar49 + fVar16 * fVar53 + fVar13 * fVar46 + fVar10 * fVar50) +
         fVar55 * (fVar7 * fVar49 + fVar4 * fVar53 + fVar2 * fVar46 + fVar52 * fVar50)) * fVar48;
    (ddPdudu->field_0).v[3] =
         (u * (fVar49 * fVar44 + fVar53 * fVar41 + fVar46 * fVar38 + fVar50 * fVar35) +
          fVar54 * (fVar32 * fVar49 + fVar29 * fVar53 + fVar26 * fVar46 + fVar23 * fVar50) +
          fVar51 * (fVar20 * fVar49 + fVar17 * fVar53 + fVar14 * fVar46 + fVar11 * fVar50) +
         fVar55 * (fVar8 * fVar49 + fVar5 * fVar53 + fVar3 * fVar46 + fVar56 * fVar50)) * fVar48;
    fVar54 = v - (fVar58 + fVar58);
    fVar53 = fVar58 - (v + v);
    fVar45 = this->v[3][0].field_0.v[1];
    fVar52 = this->v[3][0].field_0.v[2];
    fVar56 = this->v[3][0].field_0.v[3];
    fVar1 = this->v[2][0].field_0.v[1];
    fVar2 = this->v[2][0].field_0.v[2];
    fVar3 = this->v[2][0].field_0.v[3];
    fVar47 = this->v[1][0].field_0.v[1];
    fVar4 = this->v[1][0].field_0.v[2];
    fVar5 = this->v[1][0].field_0.v[3];
    fVar6 = this->v[0][0].field_0.v[1];
    fVar7 = this->v[0][0].field_0.v[2];
    fVar8 = this->v[0][0].field_0.v[3];
    fVar9 = this->v[3][1].field_0.v[1];
    fVar10 = this->v[3][1].field_0.v[2];
    fVar11 = this->v[3][1].field_0.v[3];
    fVar12 = this->v[2][1].field_0.v[1];
    fVar13 = this->v[2][1].field_0.v[2];
    fVar14 = this->v[2][1].field_0.v[3];
    fVar15 = this->v[1][1].field_0.v[1];
    fVar16 = this->v[1][1].field_0.v[2];
    fVar17 = this->v[1][1].field_0.v[3];
    fVar18 = this->v[0][1].field_0.v[1];
    fVar19 = this->v[0][1].field_0.v[2];
    fVar20 = this->v[0][1].field_0.v[3];
    fVar21 = this->v[3][2].field_0.v[1];
    fVar22 = this->v[3][2].field_0.v[2];
    fVar23 = this->v[3][2].field_0.v[3];
    fVar24 = this->v[2][2].field_0.v[1];
    fVar25 = this->v[2][2].field_0.v[2];
    fVar26 = this->v[2][2].field_0.v[3];
    fVar27 = this->v[1][2].field_0.v[1];
    fVar28 = this->v[1][2].field_0.v[2];
    fVar29 = this->v[1][2].field_0.v[3];
    fVar30 = this->v[0][2].field_0.v[1];
    fVar31 = this->v[0][2].field_0.v[2];
    fVar32 = this->v[0][2].field_0.v[3];
    fVar33 = this->v[3][3].field_0.v[1];
    fVar34 = this->v[3][3].field_0.v[2];
    fVar35 = this->v[3][3].field_0.v[3];
    fVar36 = this->v[2][3].field_0.v[1];
    fVar37 = this->v[2][3].field_0.v[2];
    fVar38 = this->v[2][3].field_0.v[3];
    fVar39 = this->v[1][3].field_0.v[1];
    fVar40 = this->v[1][3].field_0.v[2];
    fVar41 = this->v[1][3].field_0.v[3];
    fVar42 = this->v[0][3].field_0.v[1];
    fVar43 = this->v[0][3].field_0.v[2];
    fVar44 = this->v[0][3].field_0.v[3];
    fVar51 = fVar55 * u;
    fVar49 = fVar55 * fVar55 * fVar55;
    fVar46 = u * u * u;
    fVar50 = fVar49 * 0.16666667;
    fVar59 = (fVar55 * fVar51 * 12.0 + fVar51 * u * 6.0 + fVar49 * 4.0 + fVar46) * 0.16666667;
    fVar49 = (fVar51 * u * 12.0 + fVar55 * fVar51 * 6.0 + fVar46 * 4.0 + fVar49) * 0.16666667;
    fVar46 = fVar46 * 0.16666667;
    (ddPdvdv->field_0).v[0] =
         (fVar46 * (fVar58 * this->v[0][3].field_0.v[0] +
                   fVar54 * this->v[1][3].field_0.v[0] +
                   fVar53 * this->v[2][3].field_0.v[0] + v * this->v[3][3].field_0.v[0]) +
          fVar49 * (this->v[0][2].field_0.v[0] * fVar58 +
                   this->v[1][2].field_0.v[0] * fVar54 +
                   this->v[2][2].field_0.v[0] * fVar53 + this->v[3][2].field_0.v[0] * v) +
          fVar59 * (this->v[0][1].field_0.v[0] * fVar58 +
                   this->v[1][1].field_0.v[0] * fVar54 +
                   this->v[2][1].field_0.v[0] * fVar53 + this->v[3][1].field_0.v[0] * v) +
         fVar50 * (this->v[0][0].field_0.v[0] * fVar58 +
                  this->v[1][0].field_0.v[0] * fVar54 +
                  this->v[2][0].field_0.v[0] * fVar53 + this->v[3][0].field_0.v[0] * v)) * fVar48;
    (ddPdvdv->field_0).v[1] =
         (fVar46 * (fVar58 * fVar42 + fVar54 * fVar39 + fVar53 * fVar36 + v * fVar33) +
          fVar49 * (fVar30 * fVar58 + fVar27 * fVar54 + fVar24 * fVar53 + fVar21 * v) +
          fVar59 * (fVar18 * fVar58 + fVar15 * fVar54 + fVar12 * fVar53 + fVar9 * v) +
         fVar50 * (fVar6 * fVar58 + fVar47 * fVar54 + fVar1 * fVar53 + fVar45 * v)) * fVar48;
    (ddPdvdv->field_0).v[2] =
         (fVar46 * (fVar58 * fVar43 + fVar54 * fVar40 + fVar53 * fVar37 + v * fVar34) +
          fVar49 * (fVar31 * fVar58 + fVar28 * fVar54 + fVar25 * fVar53 + fVar22 * v) +
          fVar59 * (fVar19 * fVar58 + fVar16 * fVar54 + fVar13 * fVar53 + fVar10 * v) +
         fVar50 * (fVar7 * fVar58 + fVar4 * fVar54 + fVar2 * fVar53 + fVar52 * v)) * fVar48;
    (ddPdvdv->field_0).v[3] =
         (fVar46 * (fVar58 * fVar44 + fVar54 * fVar41 + fVar53 * fVar38 + v * fVar35) +
          fVar49 * (fVar32 * fVar58 + fVar29 * fVar54 + fVar26 * fVar53 + fVar23 * v) +
          fVar59 * (fVar20 * fVar58 + fVar17 * fVar54 + fVar14 * fVar53 + fVar11 * v) +
         fVar50 * (fVar8 * fVar58 + fVar5 * fVar54 + fVar3 * fVar53 + fVar56 * v)) * fVar48;
    fVar59 = -fVar58 * fVar58 * 0.5;
    fVar46 = (-v * v - fVar57 * 4.0) * 0.5;
    fVar53 = (fVar57 * 4.0 + fVar58 * fVar58) * 0.5;
    fVar54 = v * v * 0.5;
    fVar45 = this->v[3][0].field_0.v[1];
    fVar52 = this->v[3][0].field_0.v[2];
    fVar56 = this->v[3][0].field_0.v[3];
    fVar1 = this->v[2][0].field_0.v[1];
    fVar2 = this->v[2][0].field_0.v[2];
    fVar3 = this->v[2][0].field_0.v[3];
    fVar47 = this->v[1][0].field_0.v[1];
    fVar4 = this->v[1][0].field_0.v[2];
    fVar5 = this->v[1][0].field_0.v[3];
    fVar6 = this->v[0][0].field_0.v[1];
    fVar7 = this->v[0][0].field_0.v[2];
    fVar8 = this->v[0][0].field_0.v[3];
    fVar9 = this->v[3][1].field_0.v[1];
    fVar10 = this->v[3][1].field_0.v[2];
    fVar11 = this->v[3][1].field_0.v[3];
    fVar12 = this->v[2][1].field_0.v[1];
    fVar13 = this->v[2][1].field_0.v[2];
    fVar14 = this->v[2][1].field_0.v[3];
    fVar15 = this->v[1][1].field_0.v[1];
    fVar16 = this->v[1][1].field_0.v[2];
    fVar17 = this->v[1][1].field_0.v[3];
    fVar18 = this->v[0][1].field_0.v[1];
    fVar19 = this->v[0][1].field_0.v[2];
    fVar20 = this->v[0][1].field_0.v[3];
    fVar21 = this->v[3][2].field_0.v[1];
    fVar22 = this->v[3][2].field_0.v[2];
    fVar23 = this->v[3][2].field_0.v[3];
    fVar24 = this->v[2][2].field_0.v[1];
    fVar25 = this->v[2][2].field_0.v[2];
    fVar26 = this->v[2][2].field_0.v[3];
    fVar27 = this->v[1][2].field_0.v[1];
    fVar28 = this->v[1][2].field_0.v[2];
    fVar29 = this->v[1][2].field_0.v[3];
    fVar30 = this->v[0][2].field_0.v[1];
    fVar31 = this->v[0][2].field_0.v[2];
    fVar32 = this->v[0][2].field_0.v[3];
    fVar33 = this->v[3][3].field_0.v[1];
    fVar34 = this->v[3][3].field_0.v[2];
    fVar35 = this->v[3][3].field_0.v[3];
    fVar36 = this->v[2][3].field_0.v[1];
    fVar37 = this->v[2][3].field_0.v[2];
    fVar38 = this->v[2][3].field_0.v[3];
    fVar39 = this->v[1][3].field_0.v[1];
    fVar40 = this->v[1][3].field_0.v[2];
    fVar41 = this->v[1][3].field_0.v[3];
    fVar42 = this->v[0][3].field_0.v[1];
    fVar43 = this->v[0][3].field_0.v[2];
    fVar44 = this->v[0][3].field_0.v[3];
    fVar58 = -fVar55 * fVar55 * 0.5;
    fVar57 = (-u * u - fVar51 * 4.0) * 0.5;
    fVar50 = (fVar51 * 4.0 + fVar55 * fVar55) * 0.5;
    fVar49 = u * u * 0.5;
    (ddPdudv->field_0).v[0] =
         (fVar49 * (fVar59 * this->v[0][3].field_0.v[0] +
                   fVar46 * this->v[1][3].field_0.v[0] +
                   fVar53 * this->v[2][3].field_0.v[0] + fVar54 * this->v[3][3].field_0.v[0]) +
          fVar50 * (this->v[0][2].field_0.v[0] * fVar59 +
                   this->v[1][2].field_0.v[0] * fVar46 +
                   this->v[2][2].field_0.v[0] * fVar53 + this->v[3][2].field_0.v[0] * fVar54) +
          fVar57 * (this->v[0][1].field_0.v[0] * fVar59 +
                   this->v[1][1].field_0.v[0] * fVar46 +
                   this->v[2][1].field_0.v[0] * fVar53 + this->v[3][1].field_0.v[0] * fVar54) +
         fVar58 * (this->v[0][0].field_0.v[0] * fVar59 +
                  this->v[1][0].field_0.v[0] * fVar46 +
                  this->v[2][0].field_0.v[0] * fVar53 + this->v[3][0].field_0.v[0] * fVar54)) *
         fVar48;
    (ddPdudv->field_0).v[1] =
         (fVar49 * (fVar59 * fVar42 + fVar46 * fVar39 + fVar53 * fVar36 + fVar54 * fVar33) +
          fVar50 * (fVar30 * fVar59 + fVar27 * fVar46 + fVar24 * fVar53 + fVar21 * fVar54) +
          fVar57 * (fVar18 * fVar59 + fVar15 * fVar46 + fVar12 * fVar53 + fVar9 * fVar54) +
         fVar58 * (fVar6 * fVar59 + fVar47 * fVar46 + fVar1 * fVar53 + fVar45 * fVar54)) * fVar48;
    (ddPdudv->field_0).v[2] =
         (fVar49 * (fVar59 * fVar43 + fVar46 * fVar40 + fVar53 * fVar37 + fVar54 * fVar34) +
          fVar50 * (fVar31 * fVar59 + fVar28 * fVar46 + fVar25 * fVar53 + fVar22 * fVar54) +
          fVar57 * (fVar19 * fVar59 + fVar16 * fVar46 + fVar13 * fVar53 + fVar10 * fVar54) +
         fVar58 * (fVar7 * fVar59 + fVar4 * fVar46 + fVar2 * fVar53 + fVar52 * fVar54)) * fVar48;
    (ddPdudv->field_0).v[3] =
         (fVar49 * (fVar59 * fVar44 + fVar46 * fVar41 + fVar53 * fVar38 + fVar54 * fVar35) +
          fVar50 * (fVar32 * fVar59 + fVar29 * fVar46 + fVar26 * fVar53 + fVar23 * fVar54) +
          fVar57 * (fVar20 * fVar59 + fVar17 * fVar46 + fVar14 * fVar53 + fVar11 * fVar54) +
         fVar58 * (fVar8 * fVar59 + fVar5 * fVar46 + fVar3 * fVar53 + fVar56 * fVar54)) * fVar48;
  }
  return;
}

Assistant:

void eval(const float u, const float v, 
                Vertex* P, Vertex* dPdu, Vertex* dPdv, Vertex* ddPdudu, Vertex* ddPdvdv, Vertex* ddPdudv, 
                const float dscale = 1.0f) const
      {
        if (P) {
          *P = eval(u,v); 
        }
        if (dPdu) {
          assert(dPdu); *dPdu = eval_du(u,v)*dscale; 
          assert(dPdv); *dPdv = eval_dv(u,v)*dscale; 
        }
        if (ddPdudu) {
          assert(ddPdudu); *ddPdudu = eval_dudu(u,v)*sqr(dscale); 
          assert(ddPdvdv); *ddPdvdv = eval_dvdv(u,v)*sqr(dscale); 
          assert(ddPdudv); *ddPdudv = eval_dudv(u,v)*sqr(dscale); 
        }
      }